

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  __first;
  bool bVar1;
  ulong uVar2;
  string *prefix;
  pointer out;
  pointer pLVar3;
  reference pFVar4;
  ostream *poVar5;
  PointerAnalysis *pPVar6;
  unsigned_long uVar7;
  SlicerOptions *pSVar8;
  char **in_RSI;
  uint in_EDI;
  StringRef SVar9;
  uint i;
  PointerAnalysis *PA;
  DGLLVMPointerAnalysis PTA;
  LLVMPointer *ptr;
  const_iterator __end5;
  const_iterator __begin5;
  LLVMPointsToSet *__range5;
  LLVMPointsToSet pts;
  Instruction *I;
  iterator __end4;
  iterator __begin4;
  BasicBlock *__range4;
  BasicBlock *B;
  iterator __end3;
  iterator __begin3;
  Function *__range3;
  Function *F;
  iterator __end2_1;
  iterator __begin2_1;
  Module *__range2_1;
  unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_> llvmpta;
  LLVMPointerAnalysisOptions *opts;
  TimeMeasure tm;
  Function *llvmFunc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  pointer in_stack_fffffffffffff978;
  SlicerOptions *in_stack_fffffffffffff980;
  string *in_stack_fffffffffffff988;
  __normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
  in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  undefined2 in_stack_fffffffffffff99c;
  undefined1 in_stack_fffffffffffff99e;
  undefined1 in_stack_fffffffffffff99f;
  undefined1 uVar10;
  DGLLVMPointerAnalysis *in_stack_fffffffffffff9a0;
  string *in_stack_fffffffffffff9a8;
  TimeMeasure *in_stack_fffffffffffff9b0;
  allocator local_641;
  DGLLVMPointerAnalysis *in_stack_fffffffffffff9c0;
  uint local_61c;
  allocator local_609;
  string local_608 [24];
  LLVMPointerAnalysisOptions *in_stack_fffffffffffffa10;
  Module *in_stack_fffffffffffffa18;
  DGLLVMPointerAnalysis *in_stack_fffffffffffffa20;
  string local_4e8 [24];
  DGLLVMPointerAnalysis *in_stack_fffffffffffffb30;
  LLVMPointer local_4c8;
  LLVMPointer *local_4b8;
  LLVMPointsToSetImpl *local_4b0;
  LLVMPointsToSetImpl *local_4a8;
  undefined1 *local_4a0;
  string local_498 [32];
  undefined1 local_478 [8];
  Value *local_470;
  reference local_468;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_460;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
  local_458;
  reference local_450;
  reference local_448;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_440;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_438;
  reference local_430;
  Function **local_428;
  reference local_420;
  iterator in_stack_fffffffffffffbe8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_3f8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_3f0;
  type local_3e8;
  Module local_3e0 [55];
  allocator local_3a9;
  string local_3a8 [152];
  LLVMPointerAnalysisOptions *local_310;
  size_t local_2f0;
  long local_2e0;
  reference local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2c8;
  string local_2c0 [24];
  string *local_2a8;
  int local_29c;
  char local_298 [8];
  SlicerOptions local_290;
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)&local_290.dgOptions.PTAOptions.super_LLVMAnalysisOptions.field_0x10,
                     (char **)(ulong)local_8,SUB81(local_10,0),false);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1621dc);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1621f7);
  if (bVar1) {
    local_290.dgOptions.PTAOptions.super_LLVMAnalysisOptions._15_1_ = 1;
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,_false,_llvm::cl::parser<bool>_> *)in_stack_fffffffffffff980,
               (bool *)in_stack_fffffffffffff978);
  }
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x16222c);
  if (bVar1) {
    local_290.dgOptions.PTAOptions.super_LLVMAnalysisOptions._14_1_ = 1;
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,_false,_llvm::cl::parser<bool>_> *)in_stack_fffffffffffff980,
               (bool *)in_stack_fffffffffffff978);
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)&local_290);
  parseModule(local_298,(LLVMContext *)"llvm-pta-dump",&local_290);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16228c);
  if (bVar1) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      splitList(local_2c0,-0x48);
      local_2a8 = local_2c0;
      local_2c8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff978);
      local_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff978);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff980,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffff978), bVar1) {
        local_2d8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_2c8);
        in_stack_fffffffffffff9b0 =
             (TimeMeasure *)
             std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator->
                       ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16236b);
        llvm::StringRef::StringRef
                  ((StringRef *)in_stack_fffffffffffff980,(string *)in_stack_fffffffffffff978);
        SVar9.Length = local_2f0;
        SVar9.Data = (char *)in_stack_fffffffffffff9b0;
        local_2e0 = llvm::Module::getFunction(SVar9);
        if (local_2e0 == 0) {
          llvm::errs();
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffff990._M_current,
                     (char *)in_stack_fffffffffffff988);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffff990._M_current,in_stack_fffffffffffff988);
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffff990._M_current,
                     (char *)in_stack_fffffffffffff988);
          local_4 = 1;
          local_29c = 1;
          goto LAB_00162423;
        }
        std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::push_back
                  ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                   in_stack_fffffffffffff990._M_current,(value_type *)in_stack_fffffffffffff988);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_2c8);
      }
      local_29c = 2;
LAB_00162423:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff990._M_current);
      if (local_29c != 2) goto LAB_00162e8b;
    }
    dg::debug::TimeMeasure::TimeMeasure((TimeMeasure *)in_stack_fffffffffffff980);
    local_310 = (LLVMPointerAnalysisOptions *)
                &local_290.dgOptions.PTAOptions.super_LLVMAnalysisOptions.field_0x10;
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x162474);
    if (bVar1) {
      std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x162bee);
      dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffff980,
                 (LLVMPointerAnalysisOptions *)in_stack_fffffffffffff978);
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffff980);
      dg::debug::TimeMeasure::start((TimeMeasure *)in_stack_fffffffffffff980);
      dg::DGLLVMPointerAnalysis::initialize(in_stack_fffffffffffff9c0);
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x162c5c);
      if (bVar1) {
        dg::debug::TimeMeasure::stop((TimeMeasure *)in_stack_fffffffffffff980);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_608,"INFO: Pointer analysis (building graph) took",&local_609);
        dg::debug::TimeMeasure::report
                  (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                   (ostream *)in_stack_fffffffffffff9a0);
        std::__cxx11::string::~string(local_608);
        std::allocator<char>::~allocator((allocator<char> *)&local_609);
        dumpPointerGraph(in_stack_fffffffffffff9a0,
                         CONCAT13(in_stack_fffffffffffff99f,
                                  CONCAT12(in_stack_fffffffffffff99e,in_stack_fffffffffffff99c)));
      }
      else {
        pPVar6 = dg::DGLLVMPointerAnalysis::getPTA((DGLLVMPointerAnalysis *)0x162d08);
        uVar7 = llvm::cl::opt_storage::operator_cast_to_unsigned_long
                          ((opt_storage<unsigned_long,_false,_false> *)0x162d20);
        if (uVar7 == 0) {
          dg::pta::PointerAnalysis::run();
        }
        else {
          (*pPVar6->_vptr_PointerAnalysis[6])();
          dg::pta::PointerAnalysis::initialize_queue((PointerAnalysis *)in_stack_fffffffffffff9a0);
          local_61c = 0;
          while( true ) {
            in_stack_fffffffffffff980 = (SlicerOptions *)(ulong)local_61c;
            pSVar8 = (SlicerOptions *)
                     llvm::cl::opt_storage::operator_cast_to_unsigned_long
                               ((opt_storage<unsigned_long,_false,_false> *)0x162d5f);
            if ((pSVar8 <= in_stack_fffffffffffff980) ||
               (bVar1 = dg::pta::PointerAnalysis::iteration
                                  ((PointerAnalysis *)in_stack_fffffffffffff9a0), !bVar1)) break;
            dg::pta::PointerAnalysis::queue_changed((PointerAnalysis *)in_stack_fffffffffffff9a0);
            local_61c = local_61c + 1;
          }
        }
        dg::debug::TimeMeasure::stop((TimeMeasure *)in_stack_fffffffffffff980);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffff9c0,"INFO: Pointer analysis took",&local_641);
        dg::debug::TimeMeasure::report
                  (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,
                   (ostream *)in_stack_fffffffffffff9a0);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffff9c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_641);
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x162e0c);
        if (bVar1) {
          dumpStats(in_stack_fffffffffffffb30);
        }
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x162e32);
        if (!bVar1) {
          dumpPointerGraph(in_stack_fffffffffffff9a0,
                           CONCAT13(in_stack_fffffffffffff99f,
                                    CONCAT12(in_stack_fffffffffffff99e,in_stack_fffffffffffff99c)));
        }
      }
      local_4 = 0;
      local_29c = 1;
      dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis
                ((DGLLVMPointerAnalysis *)in_stack_fffffffffffff980);
    }
    else {
      std::unique_ptr<dg::LLVMPointerAnalysis,std::default_delete<dg::LLVMPointerAnalysis>>::
      unique_ptr<std::default_delete<dg::LLVMPointerAnalysis>,void>
                ((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                  *)in_stack_fffffffffffff980);
      prefix = (string *)operator_new(0x90);
      out = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                      ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1624a5);
      dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffff980,
                 (LLVMPointerAnalysisOptions *)in_stack_fffffffffffff978);
      dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::reset
                ((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                  *)in_stack_fffffffffffff980,in_stack_fffffffffffff978);
      dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions
                ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffff980);
      dg::debug::TimeMeasure::start((TimeMeasure *)in_stack_fffffffffffff980);
      pLVar3 = std::
               unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::
               operator->((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                           *)0x16250f);
      (*pLVar3->_vptr_LLVMPointerAnalysis[3])();
      dg::debug::TimeMeasure::stop((TimeMeasure *)in_stack_fffffffffffff980);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3a8,"INFO: Pointer analysis took",&local_3a9);
      dg::debug::TimeMeasure::report(in_stack_fffffffffffff9b0,prefix,(ostream *)out);
      std::__cxx11::string::~string(local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x162597);
      if (bVar1) {
        bVar1 = dg::LLVMPointerAnalysisOptions::isSVF(local_310);
        if (bVar1) {
          llvm::errs();
          llvm::raw_ostream::operator<<
                    ((raw_ostream *)in_stack_fffffffffffff990._M_current,
                     (char *)in_stack_fffffffffffff988);
        }
        else {
          std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::
          get((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_> *)
              0x1625d3);
          dumpStats(in_stack_fffffffffffffb30);
        }
      }
      else {
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x162609);
        if (!bVar1) {
          bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x16263d);
          if (bVar1) {
            std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                      ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                       in_stack_fffffffffffff980);
            allocasToVars(local_3e0);
            std::
            map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
            ::operator=((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                         *)in_stack_fffffffffffff980,
                        (map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                         *)in_stack_fffffffffffff978);
            std::
            map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
            ::~map((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                    *)0x162681);
            bVar1 = std::
                    map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                    ::empty((map<const_llvm::Value_*,_CVariableDecl,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                             *)0x16268d);
            if (bVar1) {
              llvm::errs();
              llvm::raw_ostream::operator<<
                        ((raw_ostream *)in_stack_fffffffffffff990._M_current,
                         (char *)in_stack_fffffffffffff988);
              llvm::raw_ostream::operator<<
                        ((raw_ostream *)in_stack_fffffffffffff990._M_current,
                         (char *)in_stack_fffffffffffff988);
            }
          }
          local_3e8 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                                ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                                 in_stack_fffffffffffff980);
          local_3f0.NodePtr = (node_pointer)llvm::Module::begin((Module *)in_stack_fffffffffffff978)
          ;
          local_3f8.NodePtr = (node_pointer)llvm::Module::end((Module *)in_stack_fffffffffffff978);
          while (bVar1 = llvm::operator!=(&local_3f0,&local_3f8), bVar1) {
            pFVar4 = llvm::
                     ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                     ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                  *)0x162722);
            bVar1 = std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
                    empty((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *
                          )in_stack_fffffffffffff990._M_current);
            uVar10 = false;
            if (!bVar1) {
              std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::begin
                        ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *)
                         in_stack_fffffffffffff978);
              in_stack_fffffffffffffbe8 =
                   std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::end
                             ((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                               *)in_stack_fffffffffffff978);
              __first._M_current._4_2_ = in_stack_fffffffffffff99c;
              __first._M_current._0_4_ = in_stack_fffffffffffff998;
              __first._M_current._6_1_ = in_stack_fffffffffffff99e;
              __first._M_current._7_1_ = uVar10;
              local_420 = pFVar4;
              std::
              find<__gnu_cxx::__normal_iterator<llvm::Function_const**,std::vector<llvm::Function_const*,std::allocator<llvm::Function_const*>>>,llvm::Function*>
                        (__first,in_stack_fffffffffffff990,(Function **)in_stack_fffffffffffff988);
              local_428 = (Function **)
                          std::
                          vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>::
                          end((vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                               *)in_stack_fffffffffffff978);
              uVar10 = __gnu_cxx::operator==
                                 ((__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                                   *)in_stack_fffffffffffff980,
                                  (__normal_iterator<const_llvm::Function_**,_std::vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>_>
                                   *)in_stack_fffffffffffff978);
            }
            if ((bool)uVar10 == false) {
              local_430 = pFVar4;
              local_438.NodePtr =
                   (node_pointer)llvm::Function::begin((Function *)in_stack_fffffffffffff978);
              local_440.NodePtr =
                   (node_pointer)llvm::Function::end((Function *)in_stack_fffffffffffff978);
              while (bVar1 = llvm::operator!=(&local_438,&local_440), bVar1) {
                local_450 = llvm::
                            ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                            ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                         *)0x162845);
                local_448 = local_450;
                local_458.NodePtr =
                     (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_fffffffffffff978);
                local_460.NodePtr =
                     (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_fffffffffffff978);
                while (bVar1 = llvm::operator!=(&local_458,&local_460), bVar1) {
                  local_468 = llvm::
                              ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                              ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                           *)0x1628b2);
                  llvm::Value::getType((Value *)local_468);
                  bVar1 = llvm::Type::isPointerTy((Type *)0x1628cf);
                  if (bVar1) {
LAB_001628f1:
                    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                                      ((opt_storage<bool,_false,_false> *)0x162904);
                    in_stack_fffffffffffff99e = false;
                    if (bVar1) {
                      local_470 = (Value *)local_468;
                      in_stack_fffffffffffff99e =
                           llvm::isa<llvm::AllocaInst,llvm::Instruction*>((Instruction **)0x162930);
                    }
                    if ((bool)in_stack_fffffffffffff99e == false) {
                      pLVar3 = std::
                               unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                               ::operator->((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                                             *)0x162950);
                      (*pLVar3->_vptr_LLVMPointerAnalysis[1])(local_478,pLVar3,local_468);
                      bVar1 = dg::LLVMPointsToSet::isUnknownSingleton
                                        ((LLVMPointsToSet *)in_stack_fffffffffffff980);
                      if (bVar1) {
                        local_29c = 9;
                      }
                      else {
                        valToStr_abi_cxx11_((Value *)in_stack_fffffffffffffbe8._M_current);
                        poVar5 = std::operator<<((ostream *)&std::cout,local_498);
                        std::operator<<(poVar5,"\n");
                        std::__cxx11::string::~string(local_498);
                        local_4a0 = local_478;
                        local_4a8 = (LLVMPointsToSetImpl *)
                                    dg::LLVMPointsToSet::begin
                                              ((LLVMPointsToSet *)in_stack_fffffffffffff978);
                        local_4b0 = (LLVMPointsToSetImpl *)dg::LLVMPointsToSet::end();
                        while (bVar1 = dg::LLVMPointsToSet::const_iterator::operator!=
                                                 ((const_iterator *)in_stack_fffffffffffff980,
                                                  (const_iterator *)in_stack_fffffffffffff978),
                              bVar1) {
                          local_4c8 = dg::LLVMPointsToSet::const_iterator::operator*
                                                ((const_iterator *)0x162a2e);
                          local_4b8 = &local_4c8;
                          in_stack_fffffffffffff990._M_current =
                               (Function **)std::operator<<((ostream *)&std::cout,"  -> ");
                          valToStr_abi_cxx11_((Value *)in_stack_fffffffffffffbe8._M_current);
                          poVar5 = std::operator<<((ostream *)in_stack_fffffffffffff990._M_current,
                                                   local_4e8);
                          std::operator<<(poVar5,"\n");
                          std::__cxx11::string::~string(local_4e8);
                          dg::LLVMPointsToSet::const_iterator::operator++
                                    ((const_iterator *)in_stack_fffffffffffff980);
                        }
                        bVar1 = dg::LLVMPointsToSet::hasUnknown((LLVMPointsToSet *)0x162acb);
                        if (bVar1) {
                          std::operator<<((ostream *)&std::cout,"  -> unknown\n");
                        }
                        bVar1 = dg::LLVMPointsToSet::hasNull((LLVMPointsToSet *)0x162af1);
                        if (bVar1) {
                          std::operator<<((ostream *)&std::cout,"  -> null\n");
                        }
                        bVar1 = dg::LLVMPointsToSet::hasNullWithOffset((LLVMPointsToSet *)0x162b17);
                        if (bVar1) {
                          std::operator<<((ostream *)&std::cout,"  -> null + ?\n");
                        }
                        bVar1 = dg::LLVMPointsToSet::hasInvalidated((LLVMPointsToSet *)0x162b3d);
                        if (bVar1) {
                          std::operator<<((ostream *)&std::cout,"  -> invalidated\n");
                        }
                        local_29c = 0;
                      }
                      dg::LLVMPointsToSet::~LLVMPointsToSet((LLVMPointsToSet *)0x162b6e);
                    }
                  }
                  else {
                    llvm::Value::getType((Value *)local_468);
                    bVar1 = llvm::Type::isIntegerTy((Type *)0x1628e8);
                    if (bVar1) goto LAB_001628f1;
                  }
                  llvm::
                  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                  ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                *)in_stack_fffffffffffff980);
                }
                llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                              *)in_stack_fffffffffffff980);
              }
            }
            llvm::
            ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
            ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                          *)in_stack_fffffffffffff980);
          }
        }
      }
      local_4 = 0;
      local_29c = 1;
      std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::
      ~unique_ptr((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>
                   *)in_stack_fffffffffffff980);
    }
  }
  else {
    local_4 = 1;
    local_29c = 1;
  }
LAB_00162e8b:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffff980);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)&local_290);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffff980);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (verbose_more) {
        verbose = true;
    }
    if (callgraph_only) {
        callgraph = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-pta-dump", context, options);
    if (!M)
        return 1;

    if (!display_only.empty()) {
        for (const auto &func : splitList(display_only)) {
            auto *llvmFunc = M->getFunction(func);
            if (!llvmFunc) {
                llvm::errs() << "Invalid function to display: " << func
                             << ". Function not found in the module\n";
                return 1;
            }
            display_only_func.push_back(llvmFunc);
        }
    }

    TimeMeasure tm;
    auto &opts = options.dgOptions.PTAOptions;

#ifdef HAVE_SVF
    if (opts.isSVF()) {
        assert(dump_iteration == 0 && "SVF does not support -iteration");
        assert(!dump_graph_only && "SVF does not support -dump_graph_only");
        assert(!dump_graph_only && "SVF does not support -statistics yet");
    }
#endif

    if (!dump_ir) {
        std::unique_ptr<LLVMPointerAnalysis> llvmpta;

#ifdef HAVE_SVF
        if (opts.isSVF())
            llvmpta.reset(new SVFPointerAnalysis(M.get(), opts));
        else
#endif
            llvmpta.reset(new DGLLVMPointerAnalysis(M.get(), opts));

        tm.start();
        llvmpta->run();
        tm.stop();
        tm.report("INFO: Pointer analysis took");

        if (_stats) {
            if (opts.isSVF()) {
                llvm::errs() << "SVF analysis does not support stats dumping\n";
            } else {
                dumpStats(static_cast<DGLLVMPointerAnalysis *>(llvmpta.get()));
            }
            return 0;
        }

        if (_quiet) {
            return 0;
        }

        if (dump_c_lines) {
#if (LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR < 7)
            llvm::errs() << "WARNING: Variables names matching is not "
                            "supported for LLVM older than 3.7\n";
#else
            valuesToVars = allocasToVars(*M);
#endif // LLVM > 3.6
            if (valuesToVars.empty()) {
                llvm::errs() << "WARNING: No debugging information found, "
                             << "the C lines output will be corrupted\n";
            }
        }

        for (auto &F : *M) {
            if (!display_only_func.empty() &&
                std::find(display_only_func.begin(), display_only_func.end(),
                          &F) == display_only_func.end()) {
                continue;
            }
            for (auto &B : F) {
                for (auto &I : B) {
                    if (!I.getType()->isPointerTy() &&
                        !I.getType()->isIntegerTy()) {
                        continue;
                    }

                    if (dump_c_lines && llvm::isa<llvm::AllocaInst>(&I)) {
                        // do not dump I->I for alloca, it makes no sense for C
                        continue;
                    }

                    auto pts = llvmpta->getLLVMPointsTo(&I);
                    if (pts.isUnknownSingleton()) {
                        // do not dump the "no-information"
                        continue;
                    }

                    std::cout << valToStr(&I) << "\n";
                    for (const auto &ptr : pts) {
                        std::cout << "  -> " << valToStr(ptr.value) << "\n";
                    }
                    if (pts.hasUnknown()) {
                        std::cout << "  -> unknown\n";
                    }
                    if (pts.hasNull()) {
                        std::cout << "  -> null\n";
                    }
                    if (pts.hasNullWithOffset()) {
                        std::cout << "  -> null + ?\n";
                    }
                    if (pts.hasInvalidated()) {
                        std::cout << "  -> invalidated\n";
                    }
                }
            }
        }
        return 0;
    }

    ///
    // Dumping the IR of pointer analysis
    //
    DGLLVMPointerAnalysis PTA(M.get(), opts);

    tm.start();

    PTA.initialize();

    if (dump_graph_only) {
        tm.stop();
        tm.report("INFO: Pointer analysis (building graph) took");
        dumpPointerGraph(&PTA, opts.analysisType);
        return 0;
    }

    auto *PA = PTA.getPTA();
    assert(PA && "Did not initialize the analysis");

    // run the analysis
    if (dump_iteration > 0) {
        // do preprocessing and queue the nodes
        PA->preprocess();
        PA->initialize_queue();

        // do fixpoint
        for (unsigned i = 0; i < dump_iteration; ++i) {
            if (!PA->iteration())
                break;
            PA->queue_changed();
        }
    } else {
        PA->run();
    }

    tm.stop();
    tm.report("INFO: Pointer analysis took");

    if (_stats) {
        dumpStats(&PTA);
    }

    if (_quiet)
        return 0;

    dumpPointerGraph(&PTA, opts.analysisType);

    return 0;
}